

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O2

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::AttributeSymbol::fromSyntax
          (AttributeSymbol *this,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,Symbol *symbol)

{
  ParentList *pPVar1;
  Token *this_00;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  Symbol *pSVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  AttributeSpecSyntax *pAVar14;
  ConstantValue *args_2;
  uint64_t uVar15;
  Diagnostic *this_01;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  ulong uVar17;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_02;
  size_t extraout_RDX_03;
  ulong uVar18;
  long lVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  BumpAllocator *this_02;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong pos0;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string_view sVar24;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar25;
  try_emplace_args_t local_1f9;
  AttributeSymbol *attr;
  string_view name;
  SourceLocation local_1d0 [2];
  AttributeSymbol *local_1c0;
  const_iterator __begin3;
  ConstantValue value;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  pointer ppAVar16;
  
  if (syntax._M_ptr == (pointer)0x0) {
    _Var20._M_extent_value = 0;
    ppAVar16 = (pointer)0x0;
  }
  else {
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
    ::SmallMap(&nameMap);
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    this_02 = *(BumpAllocator **)syntax._M_extent._M_extent_value._M_extent_value;
    pSVar9 = &this->super_Symbol;
    src = extraout_RDX;
    for (; this != (AttributeSymbol *)(&pSVar9->kind + (long)syntax._M_ptr * 2);
        this = (AttributeSymbol *)&(this->super_Symbol).name) {
      pPVar1 = (ParentList *)(*(long *)&this->super_Symbol + 0x38);
      __begin3.index = 0;
      lVar3 = *(long *)(*(long *)&this->super_Symbol + 0x68);
      local_1c0 = this;
      __begin3.list = pPVar1;
      for (; (__begin3.list != pPVar1 || (__begin3.index != lVar3 + 1U >> 1));
          __begin3.index = __begin3.index + 1) {
        pAVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
                  iterator_base<const_slang::syntax::AttributeSpecSyntax_*>::dereference(&__begin3);
        this_00 = &pAVar14->name;
        sVar24 = parsing::Token::valueText(this_00);
        src = (EVP_PKEY_CTX *)sVar24._M_str;
        name = sVar24;
        if (sVar24._M_len != 0) {
          if (pAVar14->value == (EqualsValueClauseSyntax *)0x0) {
            SVInt::SVInt((SVInt *)local_1d0,1,1,false);
            std::
            variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
            ::variant<slang::SVInt,void,void,slang::SVInt,void>
                      ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        *)&value,(SVInt *)local_1d0);
            SVInt::~SVInt((SVInt *)local_1d0);
            local_1d0[0] = parsing::Token::location(this_00);
            args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                               ((TypedBumpAllocator<slang::ConstantValue> *)&this_02[0xd].endPtr,
                                &value);
            attr = BumpAllocator::
                   emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                             (this_02,&name,local_1d0,args_2);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&value);
          }
          else {
            local_1d0[0] = parsing::Token::location(this_00);
            value.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_u._M_rest._0_16_ = (undefined1  [16])(undefined1  [16])sVar24;
            attr = BumpAllocator::
                   emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
                             (this_02,(basic_string_view<char,_std::char_traits<char>_> *)&value,
                              local_1d0,(Symbol *)scope,(pAVar14->value->expr).ptr);
          }
          (attr->super_Symbol).originatingSyntax = &pAVar14->super_SyntaxNode;
          uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &nameMap.super_Storage.field_0x68,&name);
          uVar18 = uVar15 >> (nameMap._112_1_ & 0x3f);
          lVar19 = (uVar15 & 0xff) * 4;
          cVar5 = (&UNK_004a00ac)[lVar19];
          cVar6 = (&UNK_004a00ad)[lVar19];
          cVar7 = (&UNK_004a00ae)[lVar19];
          bVar8 = (&UNK_004a00af)[lVar19];
          uVar17 = 0;
          do {
            pcVar2 = (char *)(nameMap._128_8_ + uVar18 * 0x10);
            bVar11 = pcVar2[0xf];
            auVar22[0] = -(*pcVar2 == cVar5);
            auVar22[1] = -(pcVar2[1] == cVar6);
            auVar22[2] = -(pcVar2[2] == cVar7);
            auVar22[3] = -(pcVar2[3] == bVar8);
            auVar22[4] = -(pcVar2[4] == cVar5);
            auVar22[5] = -(pcVar2[5] == cVar6);
            auVar22[6] = -(pcVar2[6] == cVar7);
            auVar22[7] = -(pcVar2[7] == bVar8);
            auVar22[8] = -(pcVar2[8] == cVar5);
            auVar22[9] = -(pcVar2[9] == cVar6);
            auVar22[10] = -(pcVar2[10] == cVar7);
            auVar22[0xb] = -(pcVar2[0xb] == bVar8);
            auVar22[0xc] = -(pcVar2[0xc] == cVar5);
            auVar22[0xd] = -(pcVar2[0xd] == cVar6);
            auVar22[0xe] = -(pcVar2[0xe] == cVar7);
            auVar22[0xf] = -(bVar11 == bVar8);
            uVar12 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
            if (uVar12 != 0) {
              lVar21 = nameMap._128_8_ + uVar18 * 0x10;
              lVar19 = nameMap._136_8_ + uVar18 * 0x168;
              do {
                uVar4 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                __y = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)uVar4 * 0x18 + lVar19);
                bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&nameMap.super_Storage.field_0x68,&name,__y);
                if (bVar10) {
                  this_01 = Scope::addDiag((Scope *)syntax._M_extent._M_extent_value._M_extent_value
                                           ,(DiagCode)0xed0006,(attr->super_Symbol).location);
                  this = local_1c0;
                  Diagnostic::operator<<(this_01,name);
                  attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_
                  [__y[1]._M_len] = attr;
                  src = (EVP_PKEY_CTX *)
                        attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_;
                  goto LAB_0045f958;
                }
                uVar12 = uVar12 - 1 & uVar12;
              } while (uVar12 != 0);
              bVar11 = *(byte *)(lVar21 + 0xf);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar11) == 0) break;
            lVar19 = uVar18 + uVar17;
            uVar17 = uVar17 + 1;
            uVar18 = lVar19 + 1U & nameMap._120_8_;
          } while (uVar17 <= (ulong)nameMap._120_8_);
          SmallVectorBase<slang::ast::AttributeSymbol_const*>::
          emplace_back<slang::ast::AttributeSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
          local_1d0[0] = (SourceLocation)
                         (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
          uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &nameMap.super_Storage.field_0x68,&name);
          pos0 = uVar15 >> (nameMap._112_1_ & 0x3f);
          lVar19 = (uVar15 & 0xff) * 4;
          cVar5 = (&UNK_004a00ac)[lVar19];
          cVar6 = (&UNK_004a00ad)[lVar19];
          cVar7 = (&UNK_004a00ae)[lVar19];
          bVar8 = (&UNK_004a00af)[lVar19];
          uVar18 = 0;
          uVar17 = pos0;
          do {
            pcVar2 = (char *)(nameMap._128_8_ + uVar17 * 0x10);
            bVar11 = pcVar2[0xf];
            auVar23[0] = -(*pcVar2 == cVar5);
            auVar23[1] = -(pcVar2[1] == cVar6);
            auVar23[2] = -(pcVar2[2] == cVar7);
            auVar23[3] = -(pcVar2[3] == bVar8);
            auVar23[4] = -(pcVar2[4] == cVar5);
            auVar23[5] = -(pcVar2[5] == cVar6);
            auVar23[6] = -(pcVar2[6] == cVar7);
            auVar23[7] = -(pcVar2[7] == bVar8);
            auVar23[8] = -(pcVar2[8] == cVar5);
            auVar23[9] = -(pcVar2[9] == cVar6);
            auVar23[10] = -(pcVar2[10] == cVar7);
            auVar23[0xb] = -(pcVar2[0xb] == bVar8);
            auVar23[0xc] = -(pcVar2[0xc] == cVar5);
            auVar23[0xd] = -(pcVar2[0xd] == cVar6);
            auVar23[0xe] = -(pcVar2[0xe] == cVar7);
            auVar23[0xf] = -(bVar11 == bVar8);
            uVar12 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
            if (uVar12 != 0) {
              lVar21 = nameMap._128_8_ + uVar17 * 0x10;
              lVar19 = nameMap._136_8_ + uVar17 * 0x168;
              do {
                uVar4 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&nameMap.super_Storage.field_0x68,&name,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    ((ulong)uVar4 * 0x18 + lVar19));
                src = extraout_RDX_00;
                this = local_1c0;
                if (bVar10) goto LAB_0045f958;
                uVar12 = uVar12 - 1 & uVar12;
              } while (uVar12 != 0);
              bVar11 = *(byte *)(lVar21 + 0xf);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar11) == 0) break;
            lVar19 = uVar17 + uVar18;
            uVar18 = uVar18 + 1;
            uVar17 = lVar19 + 1U & nameMap._120_8_;
          } while (uVar18 <= (ulong)nameMap._120_8_);
          if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                        *)&nameMap.super_Storage.field_0x68,pos0,uVar15,&local_1f9,&name,
                       (unsigned_long *)local_1d0);
            src = extraout_RDX_01;
            this = local_1c0;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                        *)&nameMap.super_Storage.field_0x68,uVar15,&local_1f9,&name,
                       (unsigned_long *)local_1d0);
            src = extraout_RDX_02;
            this = local_1c0;
          }
        }
LAB_0045f958:
      }
    }
    iVar13 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)this_02,src);
    ppAVar16 = (pointer)CONCAT44(extraout_var,iVar13);
    SmallVectorBase<const_slang::ast::AttributeSymbol_*>::cleanup
              (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
               (EVP_PKEY_CTX *)this_02);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                   *)&nameMap.super_Storage.field_0x68);
    _Var20._M_extent_value = extraout_RDX_03;
  }
  sVar25._M_extent._M_extent_value = _Var20._M_extent_value;
  sVar25._M_ptr = ppAVar16;
  return sVar25;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    const Symbol& symbol) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope, [&symbol](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, symbol, exprSyntax);
        });
}